

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

int __thiscall
cmCTest::RunMakeCommand
          (cmCTest *this,char *command,string *output,int *retVal,char *dir,int timeout,ostream *ofs
          ,Encoding encoding)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  cmsysProcess *cp_00;
  reference ppcVar5;
  ostream *poVar6;
  ulong uVar7;
  undefined1 *puVar8;
  undefined8 uVar9;
  size_t sVar10;
  void *pvVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  string local_1648 [32];
  undefined1 local_1628 [8];
  ostringstream cmCTestLog_msg_12;
  string local_14b0 [32];
  undefined1 local_1490 [8];
  ostringstream cmCTestLog_msg_11;
  string local_1318 [32];
  undefined1 local_12f8 [8];
  ostringstream cmCTestLog_msg_10;
  string local_1180 [32];
  undefined1 local_1160 [8];
  ostringstream cmCTestLog_msg_9;
  string local_fe0 [4];
  int result;
  undefined1 local_fc0 [8];
  ostringstream cmCTestLog_msg_8;
  cmCTestLogWrite local_e48;
  string local_e38 [32];
  cmCTestLogWrite local_e18;
  undefined1 local_e08 [8];
  ostringstream cmCTestLog_msg_7;
  string local_c90;
  cmCTestLogWrite local_c70;
  string local_c60 [32];
  cmCTestLogWrite local_c40;
  undefined1 local_c30 [8];
  ostringstream cmCTestLog_msg_6;
  string local_ab8 [32];
  undefined1 local_a98 [8];
  ostringstream cmCTestLog_msg_5;
  string local_920 [32];
  undefined1 local_900 [8];
  ostringstream cmCTestLog_msg_4;
  ulong local_788;
  size_t cc;
  undefined1 local_760 [8];
  ostringstream cmCTestLog_msg_3;
  undefined1 local_5e8 [8];
  string strdata;
  cmProcessOutput processOutput;
  char *pcStack_5c0;
  int length;
  char *data;
  size_type tick_line_len;
  size_type tick_len;
  size_type tick;
  cmsysProcess *local_598;
  cmsysProcess *cp;
  ostringstream local_570 [8];
  ostringstream cmCTestLog_msg_2;
  string local_3f8 [32];
  undefined1 local_3d8 [8];
  ostringstream cmCTestLog_msg_1;
  __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
  local_260;
  char **local_258;
  __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
  local_250;
  iterator ait;
  undefined1 local_228 [8];
  ostringstream cmCTestLog_msg;
  value_type local_b0 [3];
  value_type local_98;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_90;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_88;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_80;
  const_iterator a;
  vector<const_char_*,_std::allocator<const_char_*>_> argv;
  undefined1 local_58 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  int timeout_local;
  char *dir_local;
  int *retVal_local;
  string *output_local;
  char *command_local;
  cmCTest *this_local;
  
  args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = timeout;
  cmSystemTools::ParseArguments_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_58,(cmSystemTools *)command,(char *)output);
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_58);
  if (bVar1) {
    this_local._4_4_ = 0;
  }
  else {
    std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)&a);
    local_88._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_58);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_80,&local_88);
    while( true ) {
      local_90._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_58);
      bVar1 = __gnu_cxx::operator!=(&local_80,&local_90);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator->(&local_80);
      local_98 = (value_type)std::__cxx11::string::c_str();
      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)&a,&local_98);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_80);
    }
    local_b0[0] = (value_type)0x0;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)&a,local_b0);
    std::__cxx11::string::operator=((string *)output,"");
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
    std::operator<<((ostream *)local_228,"Run command:");
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    Log(this,4,
        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
        0x3d7,pcVar4,false);
    std::__cxx11::string::~string((string *)&ait);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_228);
    __gnu_cxx::
    __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>::
    __normal_iterator(&local_250);
    local_258 = (char **)std::vector<const_char_*,_std::allocator<const_char_*>_>::begin
                                   ((vector<const_char_*,_std::allocator<const_char_*>_> *)&a);
    local_250._M_current = local_258;
    while( true ) {
      local_260._M_current =
           (char **)std::vector<const_char_*,_std::allocator<const_char_*>_>::end
                              ((vector<const_char_*,_std::allocator<const_char_*>_> *)&a);
      bVar2 = __gnu_cxx::operator!=(&local_250,&local_260);
      bVar1 = false;
      if (bVar2) {
        ppcVar5 = __gnu_cxx::
                  __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                  ::operator*(&local_250);
        bVar1 = *ppcVar5 != (char *)0x0;
      }
      if (!bVar1) break;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3d8);
      poVar6 = std::operator<<((ostream *)local_3d8," \"");
      ppcVar5 = __gnu_cxx::
                __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                ::operator*(&local_250);
      poVar6 = std::operator<<(poVar6,*ppcVar5);
      std::operator<<(poVar6,"\"");
      std::__cxx11::ostringstream::str();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      Log(this,4,
          "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
          ,0x3da,pcVar4,false);
      std::__cxx11::string::~string(local_3f8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3d8);
      __gnu_cxx::
      __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>::
      operator++(&local_250);
    }
    std::__cxx11::ostringstream::ostringstream(local_570);
    std::ostream::operator<<(local_570,std::endl<char,std::char_traits<char>>);
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    Log(this,4,
        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
        0x3dc,pcVar4,false);
    std::__cxx11::string::~string((string *)&cp);
    std::__cxx11::ostringstream::~ostringstream(local_570);
    cp_00 = cmsysProcess_New();
    local_598 = cp_00;
    tick = (size_type)
           std::vector<const_char_*,_std::allocator<const_char_*>_>::begin
                     ((vector<const_char_*,_std::allocator<const_char_*>_> *)&a);
    ppcVar5 = __gnu_cxx::
              __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
              ::operator*((__normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                           *)&tick);
    cmsysProcess_SetCommand(cp_00,ppcVar5);
    cmsysProcess_SetWorkingDirectory(local_598,dir);
    cmsysProcess_SetOption(local_598,0,1);
    cmsysProcess_SetTimeout
              (local_598,
               (double)args.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    cmsysProcess_Execute(local_598);
    tick_len = 0;
    cmProcessOutput::cmProcessOutput
              ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xb),encoding,0x400);
    std::__cxx11::string::string((string *)local_5e8);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_760);
    poVar6 = std::operator<<((ostream *)local_760,"   Each . represents ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x400);
    poVar6 = std::operator<<(poVar6," bytes of output");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    poVar6 = std::operator<<(poVar6,"    ");
    std::ostream::operator<<(poVar6,std::flush<char,std::char_traits<char>>);
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    Log(this,3,
        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
        0x3f1,pcVar4,false);
    std::__cxx11::string::~string((string *)&cc);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_760);
    while (iVar3 = cmsysProcess_WaitForData
                             (local_598,&stack0xfffffffffffffa40,
                              (int *)(strdata.field_2._M_local_buf + 0xc),(double *)0x0), iVar3 != 0
          ) {
      cmProcessOutput::DecodeText
                ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xb),pcStack_5c0,
                 (long)(int)strdata.field_2._12_4_,(string *)local_5e8,0);
      for (local_788 = 0; uVar7 = std::__cxx11::string::size(), local_788 < uVar7;
          local_788 = local_788 + 1) {
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_5e8);
        if (*pcVar4 == '\0') {
          puVar8 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_5e8);
          *puVar8 = 10;
        }
      }
      std::__cxx11::string::append((string *)output);
      while (uVar7 = std::__cxx11::string::size(), tick_len * 0x400 < uVar7) {
        tick_len = tick_len + 1;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_900);
        poVar6 = std::operator<<((ostream *)local_900,".");
        std::ostream::operator<<(poVar6,std::flush<char,std::char_traits<char>>);
        std::__cxx11::ostringstream::str();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        Log(this,3,
            "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
            ,0x3fc,pcVar4,false);
        std::__cxx11::string::~string(local_920);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_900);
        if ((tick_len % 0x32 == 0) && (tick_len != 0)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a98);
          poVar6 = std::operator<<((ostream *)local_a98,"  Size: ");
          uVar9 = std::__cxx11::string::size();
          auVar12._8_4_ = (int)((ulong)uVar9 >> 0x20);
          auVar12._0_8_ = uVar9;
          auVar12._12_4_ = 0x45300000;
          poVar6 = (ostream *)
                   std::ostream::operator<<
                             (poVar6,(int)(((auVar12._8_8_ - 1.9342813113834067e+25) +
                                           ((double)CONCAT44(0x43300000,(int)uVar9) -
                                           4503599627370496.0)) * 0.0009765625 + 1.0));
          poVar6 = std::operator<<(poVar6,"K");
          poVar6 = (ostream *)
                   std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          poVar6 = std::operator<<(poVar6,"    ");
          std::ostream::operator<<(poVar6,std::flush<char,std::char_traits<char>>);
          std::__cxx11::ostringstream::str();
          pcVar4 = (char *)std::__cxx11::string::c_str();
          Log(this,3,
              "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
              ,0x401,pcVar4,false);
          std::__cxx11::string::~string(local_ab8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_a98);
        }
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c30);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      sVar10 = std::__cxx11::string::size();
      cmCTestLogWrite::cmCTestLogWrite(&local_c40,pcVar4,sVar10);
      ::operator<<((ostream *)local_c30,&local_c40);
      std::__cxx11::ostringstream::str();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      Log(this,4,
          "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
          ,0x405,pcVar4,false);
      std::__cxx11::string::~string(local_c60);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_c30);
      bVar1 = std::ios::operator_cast_to_bool
                        ((ios *)((long)&ofs->_vptr_basic_ostream +
                                (long)ofs->_vptr_basic_ostream[-3]));
      if (bVar1) {
        pcVar4 = (char *)std::__cxx11::string::c_str();
        sVar10 = std::__cxx11::string::size();
        cmCTestLogWrite::cmCTestLogWrite(&local_c70,pcVar4,sVar10);
        ::operator<<(ofs,&local_c70);
      }
    }
    std::__cxx11::string::string((string *)&local_c90);
    cmProcessOutput::DecodeText
              ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xb),&local_c90,
               (string *)local_5e8,0);
    std::__cxx11::string::~string((string *)&local_c90);
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      std::__cxx11::string::append((string *)output);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_e08);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      sVar10 = std::__cxx11::string::size();
      cmCTestLogWrite::cmCTestLogWrite(&local_e18,pcVar4,sVar10);
      ::operator<<((ostream *)local_e08,&local_e18);
      std::__cxx11::ostringstream::str();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      Log(this,4,
          "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
          ,0x40e,pcVar4,false);
      std::__cxx11::string::~string(local_e38);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_e08);
      bVar1 = std::ios::operator_cast_to_bool
                        ((ios *)((long)&ofs->_vptr_basic_ostream +
                                (long)ofs->_vptr_basic_ostream[-3]));
      if (bVar1) {
        pcVar4 = (char *)std::__cxx11::string::c_str();
        sVar10 = std::__cxx11::string::size();
        cmCTestLogWrite::cmCTestLogWrite(&local_e48,pcVar4,sVar10);
        ::operator<<(ofs,&local_e48);
      }
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_fc0);
    poVar6 = std::operator<<((ostream *)local_fc0," Size of output: ");
    uVar9 = std::__cxx11::string::size();
    auVar13._8_4_ = (int)((ulong)uVar9 >> 0x20);
    auVar13._0_8_ = uVar9;
    auVar13._12_4_ = 0x45300000;
    poVar6 = (ostream *)
             std::ostream::operator<<
                       (poVar6,(int)(((auVar13._8_8_ - 1.9342813113834067e+25) +
                                     ((double)CONCAT44(0x43300000,(int)uVar9) - 4503599627370496.0))
                                    * 0.0009765625));
    poVar6 = std::operator<<(poVar6,"K");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    Log(this,3,
        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
        0x414,pcVar4,false);
    std::__cxx11::string::~string(local_fe0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_fc0);
    cmsysProcess_WaitForExit(local_598,(double *)0x0);
    this_local._4_4_ = cmsysProcess_GetState(local_598);
    if (this_local._4_4_ == 4) {
      iVar3 = cmsysProcess_GetExitValue(local_598);
      *retVal = iVar3;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1160);
      poVar6 = std::operator<<((ostream *)local_1160,"Command exited with the value: ");
      pvVar11 = (void *)std::ostream::operator<<(poVar6,*retVal);
      std::ostream::operator<<(pvVar11,std::endl<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::str();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      Log(this,4,
          "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
          ,0x41d,pcVar4,false);
      std::__cxx11::string::~string(local_1180);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1160);
    }
    else if (this_local._4_4_ == 2) {
      iVar3 = cmsysProcess_GetExitException(local_598);
      *retVal = iVar3;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_12f8);
      poVar6 = std::operator<<((ostream *)local_12f8,"There was an exception: ");
      pvVar11 = (void *)std::ostream::operator<<(poVar6,*retVal);
      std::ostream::operator<<(pvVar11,std::endl<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::str();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      Log(this,5,
          "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
          ,0x421,pcVar4,false);
      std::__cxx11::string::~string(local_1318);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_12f8);
    }
    else if (this_local._4_4_ == 5) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1490);
      poVar6 = std::operator<<((ostream *)local_1490,"There was a timeout");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::str();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      Log(this,5,
          "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
          ,0x423,pcVar4,false);
      std::__cxx11::string::~string(local_14b0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1490);
    }
    else if (this_local._4_4_ == 1) {
      std::__cxx11::string::operator+=((string *)output,"\n*** ERROR executing: ");
      pcVar4 = cmsysProcess_GetErrorString(local_598);
      std::__cxx11::string::operator+=((string *)output,pcVar4);
      std::__cxx11::string::operator+=((string *)output,"\n***The build process failed.");
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1628);
      poVar6 = std::operator<<((ostream *)local_1628,"There was an error: ");
      pcVar4 = cmsysProcess_GetErrorString(local_598);
      poVar6 = std::operator<<(poVar6,pcVar4);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::str();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      Log(this,6,
          "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
          ,0x429,pcVar4,false);
      std::__cxx11::string::~string(local_1648);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1628);
    }
    cmsysProcess_Delete(local_598);
    std::__cxx11::string::~string((string *)local_5e8);
    cmProcessOutput::~cmProcessOutput((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xb));
    std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)&a);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_58);
  return this_local._4_4_;
}

Assistant:

int cmCTest::RunMakeCommand(const char* command, std::string& output,
                            int* retVal, const char* dir, int timeout,
                            std::ostream& ofs, Encoding encoding)
{
  // First generate the command and arguments
  std::vector<std::string> args = cmSystemTools::ParseArguments(command);

  if (args.empty()) {
    return false;
  }

  std::vector<const char*> argv;
  for (std::vector<std::string>::const_iterator a = args.begin();
       a != args.end(); ++a) {
    argv.push_back(a->c_str());
  }
  argv.push_back(CM_NULLPTR);

  output = "";
  cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, "Run command:");
  std::vector<const char*>::iterator ait;
  for (ait = argv.begin(); ait != argv.end() && *ait; ++ait) {
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, " \"" << *ait << "\"");
  }
  cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, std::endl);

  // Now create process object
  cmsysProcess* cp = cmsysProcess_New();
  cmsysProcess_SetCommand(cp, &*argv.begin());
  cmsysProcess_SetWorkingDirectory(cp, dir);
  cmsysProcess_SetOption(cp, cmsysProcess_Option_HideWindow, 1);
  cmsysProcess_SetTimeout(cp, timeout);
  cmsysProcess_Execute(cp);

  // Initialize tick's
  std::string::size_type tick = 0;
  std::string::size_type tick_len = 1024;
  std::string::size_type tick_line_len = 50;

  char* data;
  int length;
  cmProcessOutput processOutput(encoding);
  std::string strdata;
  cmCTestLog(this, HANDLER_PROGRESS_OUTPUT, "   Each . represents "
               << tick_len << " bytes of output" << std::endl
               << "    " << std::flush);
  while (cmsysProcess_WaitForData(cp, &data, &length, CM_NULLPTR)) {
    processOutput.DecodeText(data, length, strdata);
    for (size_t cc = 0; cc < strdata.size(); ++cc) {
      if (strdata[cc] == 0) {
        strdata[cc] = '\n';
      }
    }
    output.append(strdata);
    while (output.size() > (tick * tick_len)) {
      tick++;
      cmCTestLog(this, HANDLER_PROGRESS_OUTPUT, "." << std::flush);
      if (tick % tick_line_len == 0 && tick > 0) {
        cmCTestLog(this, HANDLER_PROGRESS_OUTPUT,
                   "  Size: " << int((double(output.size()) / 1024.0) + 1)
                              << "K" << std::endl
                              << "    " << std::flush);
      }
    }
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
               cmCTestLogWrite(strdata.c_str(), strdata.size()));
    if (ofs) {
      ofs << cmCTestLogWrite(strdata.c_str(), strdata.size());
    }
  }
  processOutput.DecodeText(std::string(), strdata);
  if (!strdata.empty()) {
    output.append(strdata);
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
               cmCTestLogWrite(strdata.c_str(), strdata.size()));
    if (ofs) {
      ofs << cmCTestLogWrite(strdata.c_str(), strdata.size());
    }
  }
  cmCTestLog(this, HANDLER_PROGRESS_OUTPUT, " Size of output: "
               << int(double(output.size()) / 1024.0) << "K" << std::endl);

  cmsysProcess_WaitForExit(cp, CM_NULLPTR);

  int result = cmsysProcess_GetState(cp);

  if (result == cmsysProcess_State_Exited) {
    *retVal = cmsysProcess_GetExitValue(cp);
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
               "Command exited with the value: " << *retVal << std::endl);
  } else if (result == cmsysProcess_State_Exception) {
    *retVal = cmsysProcess_GetExitException(cp);
    cmCTestLog(this, WARNING, "There was an exception: " << *retVal
                                                         << std::endl);
  } else if (result == cmsysProcess_State_Expired) {
    cmCTestLog(this, WARNING, "There was a timeout" << std::endl);
  } else if (result == cmsysProcess_State_Error) {
    output += "\n*** ERROR executing: ";
    output += cmsysProcess_GetErrorString(cp);
    output += "\n***The build process failed.";
    cmCTestLog(this, ERROR_MESSAGE, "There was an error: "
                 << cmsysProcess_GetErrorString(cp) << std::endl);
  }

  cmsysProcess_Delete(cp);

  return result;
}